

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

TokenOrSyntax * __thiscall
slang::syntax::PortReferenceSyntax::getChild
          (TokenOrSyntax *__return_storage_ptr__,PortReferenceSyntax *this,size_t index)

{
  Token token;
  size_t index_local;
  PortReferenceSyntax *this_local;
  
  if (index == 0) {
    token.kind = (this->name).kind;
    token._2_1_ = (this->name).field_0x2;
    token.numFlags.raw = (this->name).numFlags.raw;
    token.rawLen = (this->name).rawLen;
    token.info = (this->name).info;
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,token);
  }
  else if (index == 1) {
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,&this->select->super_SyntaxNode);
  }
  else {
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,(nullptr_t)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

TokenOrSyntax PortReferenceSyntax::getChild(size_t index) {
    switch (index) {
        case 0: return name;
        case 1: return select;
        default: return nullptr;
    }
}